

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.cpp
# Opt level: O0

ostream * operator<<(ostream *os,strings *s)

{
  string local_78 [32];
  string local_58 [32];
  strings *local_18;
  strings *s_local;
  ostream *os_local;
  
  local_18 = s;
  s_local = (strings *)os;
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::string(local_78);
  wire::strings::str((strings *)&stack0xffffffffffffffc8,(char *)s,(string *)"\x01\n",
                     (string *)local_58);
  std::operator<<(os,(string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  return (ostream *)s_local;
}

Assistant:

std::ostream &operator <<( std::ostream &os, const wire::strings &s )
{
    os << s.str();
    return os;
}